

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O1

bool duckdb::PushdownInternal
               (ClientContext *context,MultiFileOptions *options,MultiFilePushdownInfo *info,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *filters,vector<duckdb::OpenFileInfo,_true> *expanded_files)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this;
  pointer pcVar1;
  pointer pOVar2;
  pointer pOVar3;
  pointer pOVar4;
  pointer pOVar5;
  bool bVar6;
  reference pvVar7;
  const_reference pvVar8;
  size_type __n;
  HivePartitioningFilterInfo filter_info;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  size_type local_78;
  HivePartitioningFilterInfo local_70;
  
  local_70.column_map._M_h._M_buckets = &local_70.column_map._M_h._M_single_bucket;
  local_70.column_map._M_h._M_bucket_count = 1;
  local_70.column_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70.column_map._M_h._M_element_count = 0;
  local_70.column_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_70.column_map._M_h._M_rehash_policy._M_next_resize = 0;
  local_70.column_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if ((info->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (info->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar7 = vector<unsigned_long,_true>::operator[](&info->column_ids,__n);
      bVar6 = IsVirtualColumn(*pvVar7);
      if (!bVar6) {
        this = info->column_names;
        pvVar7 = vector<unsigned_long,_true>::operator[](&info->column_ids,__n);
        pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[](this,*pvVar7);
        local_98[0] = local_88;
        pcVar1 = (pvVar8->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,pcVar1,pcVar1 + pvVar8->_M_string_length);
        local_78 = __n;
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_long>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_70,(string *)local_98);
        if (local_98[0] != local_88) {
          operator_delete(local_98[0]);
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(info->column_ids).
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(info->column_ids).
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_70.hive_enabled = options->hive_partitioning;
  local_70.filename_enabled = options->filename;
  pOVar2 = (expanded_files->
           super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar3 = (expanded_files->
           super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  HivePartitioning::ApplyFiltersToFileList(context,expanded_files,filters,&local_70,info);
  pOVar4 = (expanded_files->
           super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pOVar5 = (expanded_files->
           super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_70);
  return (long)pOVar4 - (long)pOVar5 != (long)pOVar3 - (long)pOVar2;
}

Assistant:

bool PushdownInternal(ClientContext &context, const MultiFileOptions &options, MultiFilePushdownInfo &info,
                      vector<unique_ptr<Expression>> &filters, vector<OpenFileInfo> &expanded_files) {
	HivePartitioningFilterInfo filter_info;
	for (idx_t i = 0; i < info.column_ids.size(); i++) {
		if (IsVirtualColumn(info.column_ids[i])) {
			continue;
		}
		filter_info.column_map.insert({info.column_names[info.column_ids[i]], i});
	}
	filter_info.hive_enabled = options.hive_partitioning;
	filter_info.filename_enabled = options.filename;

	auto start_files = expanded_files.size();
	HivePartitioning::ApplyFiltersToFileList(context, expanded_files, filters, filter_info, info);

	if (expanded_files.size() != start_files) {
		return true;
	}

	return false;
}